

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_shape.cpp
# Opt level: O3

Reals __thiscall Omega_h::measure_edges_metric(Omega_h *this,Mesh *mesh,LOs *a2e)

{
  int *piVar1;
  Alloc *this_00;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  Reals RVar3;
  LOs local_60;
  undefined1 local_50 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_30;
  void *pvVar2;
  
  local_60.write_.shared_alloc_.alloc = (a2e->write_).shared_alloc_.alloc;
  if (((ulong)local_60.write_.shared_alloc_.alloc & 7) == 0 &&
      local_60.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_60.write_.shared_alloc_.alloc =
           (Alloc *)((local_60.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_60.write_.shared_alloc_.alloc)->use_count =
           (local_60.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  this_00 = local_60.write_.shared_alloc_.alloc;
  local_60.write_.shared_alloc_.direct_ptr = (a2e->write_).shared_alloc_.direct_ptr;
  local_40._M_pi = &local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"metric","");
  Mesh::get_array<double>((Mesh *)local_50,(Int)mesh,(string *)0x0);
  RVar3 = measure_edges_metric(this,mesh,&local_60,(Reals *)local_50);
  pvVar2 = RVar3.write_.shared_alloc_.direct_ptr;
  if ((local_50._0_8_ & 7) == 0 && (Alloc *)local_50._0_8_ != (Alloc *)0x0) {
    piVar1 = (int *)(local_50._0_8_ + 0x30);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc((Alloc *)local_50._0_8_);
      operator_delete((void *)local_50._0_8_,0x48);
      pvVar2 = extraout_RDX;
    }
  }
  if (local_40._M_pi != &local_30) {
    operator_delete(local_40._M_pi,(long)local_30._vptr__Sp_counted_base + 1);
    pvVar2 = extraout_RDX_00;
  }
  if (((ulong)this_00 & 7) == 0 && this_00 != (Alloc *)0x0) {
    piVar1 = &this_00->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(this_00);
      operator_delete(this_00,0x48);
      pvVar2 = extraout_RDX_01;
    }
  }
  RVar3.write_.shared_alloc_.direct_ptr = pvVar2;
  RVar3.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar3.write_.shared_alloc_;
}

Assistant:

Reals measure_edges_metric(Mesh* mesh, LOs a2e) {
  return measure_edges_metric(mesh, a2e, mesh->get_array<Real>(VERT, "metric"));
}